

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O2

void __thiscall
glcts::ArraysOfArrays::ExpressionsLength3<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (ExpressionsLength3<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  TestError *this_00;
  long lVar1;
  string *tested_snippet;
  allocator<char> local_f9;
  string array_declaration;
  string shader_source;
  string input [3];
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&array_declaration,"    int x[1][1][1][1];\n\n",(allocator<char> *)input);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)input,"    if (x[].length() != 2) {\n        result = 0.0f;\n    }\n",
             (allocator<char> *)&shader_source);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(input + 1),
             "    if (x[][].length() != 2)  {\n        result = 0.0f;\n    }\n",
             (allocator<char> *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(input + 2),
             "    if (x[][][].length() != 2)  {\n        result = 0.0f;\n    }\n",&local_f9);
  lVar1 = 0;
  while( true ) {
    if (lVar1 == 0x60) {
      lVar1 = 0x40;
      do {
        std::__cxx11::string::~string((string *)((long)&input[0]._M_dataplus._M_p + lVar1));
        lVar1 = lVar1 + -0x20;
      } while (lVar1 != -0x20);
      std::__cxx11::string::~string((string *)&array_declaration);
      return;
    }
    shader_source._M_dataplus._M_p = (pointer)&shader_source.field_2;
    shader_source._M_string_length = 0;
    shader_source.field_2._M_local_buf[0] = '\0';
    if (TESSELATION_EVALUATION_SHADER_TYPE < tested_shader_type) break;
    tested_snippet = (string *)((long)&input[0]._M_dataplus._M_p + lVar1);
    switch((ulong)tested_shader_type) {
    case 0:
      ExpressionsLength1<glcts::ArraysOfArrays::Interface::GL>::prepare_fragment_shader
                (&local_50,&this->super_ExpressionsLength1<glcts::ArraysOfArrays::Interface::GL>,
                 FRAGMENT_SHADER_TYPE,&array_declaration,tested_snippet);
      break;
    case 1:
      ExpressionsLength1<glcts::ArraysOfArrays::Interface::GL>::prepare_vertex_shader
                (&local_50,&this->super_ExpressionsLength1<glcts::ArraysOfArrays::Interface::GL>,
                 VERTEX_SHADER_TYPE,&array_declaration,tested_snippet);
      break;
    case 2:
      ExpressionsLength1<glcts::ArraysOfArrays::Interface::GL>::prepare_compute_shader
                (&local_50,&this->super_ExpressionsLength1<glcts::ArraysOfArrays::Interface::GL>,
                 COMPUTE_SHADER_TYPE,&array_declaration,tested_snippet);
      break;
    case 3:
      ExpressionsLength1<glcts::ArraysOfArrays::Interface::GL>::prepare_geometry_shader
                (&local_50,&this->super_ExpressionsLength1<glcts::ArraysOfArrays::Interface::GL>,
                 GEOMETRY_SHADER_TYPE,&array_declaration,tested_snippet);
      break;
    case 4:
      ExpressionsLength1<glcts::ArraysOfArrays::Interface::GL>::prepare_tess_ctrl_shader
                (&local_50,&this->super_ExpressionsLength1<glcts::ArraysOfArrays::Interface::GL>,
                 TESSELATION_CONTROL_SHADER_TYPE,&array_declaration,tested_snippet);
      break;
    case 5:
      ExpressionsLength1<glcts::ArraysOfArrays::Interface::GL>::prepare_tess_eval_shader
                (&local_50,&this->super_ExpressionsLength1<glcts::ArraysOfArrays::Interface::GL>,
                 TESSELATION_EVALUATION_SHADER_TYPE,&array_declaration,tested_snippet);
    }
    std::__cxx11::string::operator=((string *)&shader_source,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    (*(this->super_ExpressionsLength1<glcts::ArraysOfArrays::Interface::GL>).
      super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>.super_TestCase.super_TestNode.
      _vptr_TestNode[8])(this,(ulong)tested_shader_type,&shader_source);
    std::__cxx11::string::~string((string *)&shader_source);
    lVar1 = lVar1 + 0x20;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Unrecognized shader type.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
             ,0x10dd);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ExpressionsLength3<API>::test_shader_compilation(typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string array_declaration = "    int x[1][1][1][1];\n\n";
	std::string input[]			  = { "    if (x[].length() != 2) {\n"
							"        result = 0.0f;\n    }\n",
							"    if (x[][].length() != 2)  {\n"
							"        result = 0.0f;\n    }\n",
							"    if (x[][][].length() != 2)  {\n"
							"        result = 0.0f;\n    }\n" };

	for (size_t string_index = 0; string_index < sizeof(input) / sizeof(input[0]); string_index++)
	{
		std::string		   shader_source;
		const std::string& test_snippet = input[string_index];

		switch (tested_shader_type)
		{
		case TestCaseBase<API>::VERTEX_SHADER_TYPE:
			shader_source = this->prepare_vertex_shader(tested_shader_type, array_declaration, test_snippet);
			break;

		case TestCaseBase<API>::FRAGMENT_SHADER_TYPE:
			shader_source = this->prepare_fragment_shader(tested_shader_type, array_declaration, test_snippet);
			break;

		case TestCaseBase<API>::COMPUTE_SHADER_TYPE:
			shader_source = this->prepare_compute_shader(tested_shader_type, array_declaration, test_snippet);
			break;

		case TestCaseBase<API>::GEOMETRY_SHADER_TYPE:
			shader_source = this->prepare_geometry_shader(tested_shader_type, array_declaration, test_snippet);
			break;

		case TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE:
			shader_source = this->prepare_tess_ctrl_shader(tested_shader_type, array_declaration, test_snippet);
			break;

		case TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE:
			shader_source = this->prepare_tess_eval_shader(tested_shader_type, array_declaration, test_snippet);
			break;

		default:
			TCU_FAIL("Unrecognized shader type.");
			break;
		} /* switch (tested_shader_type) */

		this->execute_negative_test(tested_shader_type, shader_source);
	} /* for (int string_index = 0; ...) */
}